

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

size_t bitset_minimum(bitset_t *bitset)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  size_t k;
  size_t sVar4;
  
  lVar3 = 0;
  sVar4 = 0;
  while( true ) {
    if (bitset->arraysize == sVar4) {
      return 0;
    }
    uVar1 = bitset->array[sVar4];
    if (uVar1 != 0) break;
    sVar4 = sVar4 + 1;
    lVar3 = lVar3 + -0x40;
  }
  lVar2 = 0;
  if (uVar1 != 0) {
    for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  return lVar2 - lVar3;
}

Assistant:

size_t bitset_minimum(const bitset_t *bitset) {
    for (size_t k = 0; k < bitset->arraysize; k++) {
        uint64_t w = bitset->array[k];
        if (w != 0) {
            return roaring_trailing_zeroes(w) + k * 64;
        }
    }
    return 0;
}